

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandUnpermute(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *format;
  
  pAVar2 = pAbc->pNtkCur;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      format = "Empty network.\n";
    }
    else {
      pAVar2 = Abc_NtkDup(pAVar2);
      if (pAVar2 != (Abc_Ntk_t *)0x0) {
        Abc_NtkUnpermute(pAVar2);
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      format = "Command \"unpermute\" has failed.\n";
    }
    iVar1 = -1;
  }
  else {
    if (iVar1 != 0x68) {
      Abc_Print(-2,"Unknown switch.\n");
    }
    Abc_Print(-2,"usage: unpermute [-h]\n");
    Abc_Print(-2,"\t        restores inputs/outputs/flops before the last permutation\n");
    format = "\t-h    : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandUnpermute( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = pAbc->pNtkCur, * pNtkRes = NULL;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDup( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command \"unpermute\" has failed.\n" );
        return 1;
    }
    Abc_NtkUnpermute( pNtkRes );
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: unpermute [-h]\n" );
    Abc_Print( -2, "\t        restores inputs/outputs/flops before the last permutation\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}